

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::FreeConstraintPS::FreeConstraintPS
          (FreeConstraintPS *this,SPxLPBase<double> *lp,int _i,shared_ptr<soplex::Tolerances> *tols)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  double dVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  peVar3 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
    }
  }
  iVar1 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar2 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_0069e680;
  (this->super_PostStep).m_name = "FreeConstraint";
  (this->super_PostStep).nCols = iVar2;
  (this->super_PostStep).nRows = iVar1;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_30);
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FreeConstraintPS_0069e748;
  this->m_i = _i;
  this->m_old_i = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum + -1;
  DSVectorBase<double>::DSVectorBase<double>
            (&this->m_row,
             (SVectorBase<double> *)
             ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
             (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[_i].idx));
  dVar4 = (lp->super_LPRowSetBase<double>).object.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[_i];
  if (lp->thesense == MINIMIZE) {
    dVar4 = -dVar4;
  }
  this->m_row_obj = dVar4;
  return;
}

Assistant:

FreeConstraintPS(const SPxLPBase<R>& lp, int _i, std::shared_ptr<Tolerances> tols)
         : PostStep("FreeConstraint", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_old_i(lp.nRows() - 1)
         , m_row(lp.rowVector(_i))
         , m_row_obj(lp.rowObj(_i))
      {}